

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int __thiscall iqnet::Socket::get_last_error(Socket *this)

{
  socklen_t local_18;
  int local_14;
  socklen_t int_sz;
  int err;
  Socket *this_local;
  
  local_14 = 0;
  local_18 = 4;
  _int_sz = this;
  getsockopt(this->sock,1,4,&local_14,&local_18);
  return local_14;
}

Assistant:

int Socket::get_last_error()
{
  int err = 0;
#ifndef WIN32
  socklen_t int_sz = sizeof(err);
  ::getsockopt( sock, SOL_SOCKET, SO_ERROR, &err, &int_sz );
#else
  err=WSAGetLastError();
#endif
  return err;
}